

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test::
CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0064b798;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_targetvalue_0)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(0);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(0);
  bool use_bnb = false;
  CoinSelectionOption option = GetBitcoinOption();
  option.SetEffectiveFeeBaserate(0.0);
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, option,
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}